

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

string * __thiscall
re2::NFA::FormatCapture_abi_cxx11_(string *__return_storage_ptr__,NFA *this,char **capture)

{
  int iVar1;
  long lVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar2 = 0; lVar2 < this->ncapture_; lVar2 = lVar2 + 2) {
    if (capture[lVar2] == (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      iVar1 = (int)capture[lVar2];
      if (capture[lVar2 + 1] == (char *)0x0) {
        StringPrintf_abi_cxx11_(&local_50,"(%d,?)",(ulong)(uint)(iVar1 - *(int *)&this->btext_));
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        StringPrintf_abi_cxx11_
                  (&local_50,"(%d,%d)",(ulong)(uint)(iVar1 - *(int *)&this->btext_),
                   (ulong)(uint)((int)capture[lVar2 + 1] - *(int *)&this->btext_));
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NFA::FormatCapture(const char** capture) {
  std::string s;
  for (int i = 0; i < ncapture_; i+=2) {
    if (capture[i] == NULL)
      s += "(?,?)";
    else if (capture[i+1] == NULL)
      s += StringPrintf("(%d,?)",
                        (int)(capture[i] - btext_));
    else
      s += StringPrintf("(%d,%d)",
                        (int)(capture[i] - btext_),
                        (int)(capture[i+1] - btext_));
  }
  return s;
}